

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  FILE *__stream;
  size_t sVar2;
  undefined1 auStack_d8 [72];
  undefined8 uStack_90;
  undefined1 auStack_88 [8];
  undefined1 *local_80;
  uint local_74;
  undefined8 *puStack_70;
  int i_1;
  thread_args *args;
  undefined1 *puStack_60;
  int i;
  undefined8 local_58;
  wasm_shared_module_t *shared;
  wasm_module_t *module;
  wasm_store_t *store;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  uStack_90 = 0x10272e;
  uVar1 = wasm_engine_new();
  uStack_90 = 0x102745;
  __stream = fopen("threads.wasm","rb");
  if (__stream == (FILE *)0x0) {
    uStack_90 = 0x10275e;
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    uStack_90 = 0x10277c;
    fseek(__stream,0,2);
    uStack_90 = 0x102785;
    binary.data = (wasm_byte_t *)ftell(__stream);
    uStack_90 = 0x102798;
    fseek(__stream,0,0);
    uStack_90 = 0x1027a5;
    wasm_byte_vec_new_uninitialized(&store,binary.data);
    uStack_90 = 0x1027bb;
    sVar2 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar2 == 1) {
      uStack_90 = 0x1027e4;
      fclose(__stream);
      uStack_90 = 0x1027ed;
      module = (wasm_module_t *)wasm_store_new(uVar1);
      uStack_90 = 0x1027fe;
      shared = (wasm_shared_module_t *)wasm_module_new(module,&store);
      if (shared == (wasm_shared_module_t *)0x0) {
        uStack_90 = 0x102817;
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        uStack_90 = 0x10282c;
        wasm_byte_vec_delete(&store);
        uStack_90 = 0x102835;
        local_58 = wasm_module_share(shared);
        uStack_90 = 0x102842;
        wasm_module_delete(shared);
        uStack_90 = 0x10284b;
        wasm_store_delete(module);
        local_80 = auStack_d8;
        puStack_60 = auStack_88;
        for (args._4_4_ = 0; (int)args._4_4_ < 10; args._4_4_ = args._4_4_ + 1) {
          puStack_70 = (undefined8 *)malloc(0x18);
          *(uint *)(puStack_70 + 2) = args._4_4_;
          *puStack_70 = uVar1;
          puStack_70[1] = local_58;
          printf("Initializing thread %d...\n",(ulong)args._4_4_);
          pthread_create((pthread_t *)(local_80 + (long)(int)args._4_4_ * 8),(pthread_attr_t *)0x0,
                         run,puStack_70);
        }
        for (local_74 = 0; (int)local_74 < 10; local_74 = local_74 + 1) {
          printf("Waiting for thread: %d\n",(ulong)local_74);
          pthread_join(*(pthread_t *)(local_80 + (long)(int)local_74 * 8),(void **)0x0);
        }
        wasm_shared_module_delete(local_58);
        wasm_engine_delete(uVar1);
        argv_local._4_4_ = 0;
      }
    }
    else {
      uStack_90 = 0x1027cf;
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[]) {
  // Initialize.
  wasm_engine_t* engine = wasm_engine_new();

  // Load binary.
  FILE* file = fopen("threads.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile and share.
  own wasm_store_t* store = wasm_store_new(engine);
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  own wasm_shared_module_t* shared = wasm_module_share(module);

  wasm_module_delete(module);
  wasm_store_delete(store);

  // Spawn threads.
  pthread_t threads[N_THREADS];
  for (int i = 0; i < N_THREADS; i++) {
    thread_args* args = malloc(sizeof(thread_args));
    args->id = i;
    args->engine = engine;
    args->module = shared;
    printf("Initializing thread %d...\n", i);
    pthread_create(&threads[i], NULL, &run, args);
  }

  for (int i = 0; i < N_THREADS; i++) {
    printf("Waiting for thread: %d\n", i);
    pthread_join(threads[i], NULL);
  }

  wasm_shared_module_delete(shared);
  wasm_engine_delete(engine);

  return 0;
}